

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.hpp
# Opt level: O0

bool udpdiscovery::impl::SerializeUnsignedIntegerBigEndian<unsigned_int>
               (SerializeDirection direction,uint *value,BufferView *buffer_view)

{
  bool bVar1;
  byte bVar2;
  int local_34;
  uint v;
  int i_1;
  int n_1;
  uint8_t c;
  int i;
  int n;
  BufferView *buffer_view_local;
  uint *value_local;
  SerializeDirection direction_local;
  
  if (direction == kSerialize) {
    for (n_1 = 0; n_1 < 4; n_1 = n_1 + 1) {
      BufferView::push_back(buffer_view,(char)(*value >> (('\x03' - (char)n_1) * '\b' & 0x1fU)));
    }
  }
  else if (direction == kParse) {
    *value = 0;
    bVar1 = BufferView::CanRead(buffer_view,4);
    if (!bVar1) {
      return false;
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      bVar2 = BufferView::Read(buffer_view);
      *value = (uint)bVar2 << (('\x03' - (char)local_34) * '\b' & 0x1fU) | *value;
    }
  }
  return true;
}

Assistant:

bool SerializeUnsignedIntegerBigEndian(SerializeDirection direction,
                                       ValueType* value,
                                       BufferView* buffer_view) {
  switch (direction) {
    case kSerialize: {
      int n = sizeof(ValueType);
      for (int i = 0; i < n; ++i) {
        uint8_t c = (uint8_t)((*value) >> ((n - i - 1) * 8)) & 0xff;
        buffer_view->push_back(c);
      }
    } break;

    case kParse:
      *value = 0;
      if (buffer_view->CanRead(sizeof(ValueType))) {
        int n = sizeof(ValueType);
        for (int i = 0; i < n; ++i) {
          ValueType v = (uint8_t)buffer_view->Read();
          *value |= (v << ((n - i - 1) * 8));
        }
      } else {
        return false;
      }
      break;
  }

  return true;
}